

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

string * __thiscall
cmMakefile::GetExecutionFilePath_abi_cxx11_(string *__return_storage_ptr__,cmMakefile *this)

{
  pointer pCVar1;
  cmListFileContext *pcVar2;
  pointer pcVar3;
  
  pCVar1 = (this->CallStack).
           super__Vector_base<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->CallStack).
      super__Vector_base<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>.
      _M_impl.super__Vector_impl_data._M_start == pCVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    pcVar2 = pCVar1[-1].Context;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (pcVar2->FilePath)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + (pcVar2->FilePath)._M_string_length)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefile::GetExecutionFilePath() const
{
  if (this->CallStack.empty())
    {
    return std::string();
    }
  return this->CallStack.back().Context->FilePath;
}